

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# datarate_test.cc
# Opt level: O1

void __thiscall
datarate_test::anon_unknown_0::DatarateTestLarge::BasicRateTargeting444CBRScreenTest
          (DatarateTestLarge *this)

{
  DatarateTest *pDVar1;
  undefined8 *puVar2;
  bool bVar3;
  ParamType *pPVar4;
  aom_rational aVar5;
  SEARCH_METHODS *pSVar6;
  HasNewFatalFailureHelper gtest_fatal_failure_checker;
  Y4mVideoSource video;
  AssertHelper local_120;
  AssertHelper local_118;
  undefined1 local_110 [16];
  long local_100 [2];
  Y4mVideoSource local_f0;
  
  local_110._0_8_ = local_100;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_110,"rush_hour_444.y4m","");
  libaom_test::Y4mVideoSource::Y4mVideoSource(&local_f0,(string *)local_110,0,0x8c);
  if ((long *)local_110._0_8_ != local_100) {
    operator_delete((void *)local_110._0_8_);
  }
  (this->super_DatarateTest).super_EncoderTest.cfg_.g_profile = 1;
  aVar5.den = local_f0.framerate_numerator_;
  aVar5.num = local_f0.framerate_denominator_;
  (this->super_DatarateTest).super_EncoderTest.cfg_.g_timebase = aVar5;
  (this->super_DatarateTest).super_EncoderTest.cfg_.rc_buf_optimal_sz = 500;
  (this->super_DatarateTest).super_EncoderTest.cfg_.rc_buf_sz = 1000;
  (this->super_DatarateTest).super_EncoderTest.cfg_.rc_buf_initial_sz = 500;
  (this->super_DatarateTest).super_EncoderTest.cfg_.rc_dropframe_thresh = 1;
  (this->super_DatarateTest).super_EncoderTest.cfg_.rc_min_quantizer = 0;
  (this->super_DatarateTest).super_EncoderTest.cfg_.rc_max_quantizer = 0x3f;
  (this->super_DatarateTest).super_EncoderTest.cfg_.rc_end_usage = AOM_CBR;
  pPVar4 = testing::
           WithParamInterface<std::tuple<const_libaom_test::CodecFactory_*,_libaom_test::TestMode,_int,_unsigned_int,_int>_>
           ::GetParam();
  pDVar1 = &this->super_DatarateTest;
  (this->super_DatarateTest).super_EncoderTest.cfg_.rc_target_bitrate =
       *(uint *)(&DAT_00c7da58 +
                (long)(pPVar4->
                      super__Tuple_impl<0UL,_const_libaom_test::CodecFactory_*,_libaom_test::TestMode,_int,_unsigned_int,_int>
                      ).super__Tuple_impl<1UL,_libaom_test::TestMode,_int,_unsigned_int,_int>.
                      super__Tuple_impl<2UL,_int,_unsigned_int,_int>.
                      super__Tuple_impl<3UL,_unsigned_int,_int>.super__Tuple_impl<4UL,_int>.
                      super__Head_base<4UL,_int,_false>._M_head_impl * 4);
  (*(this->super_DatarateTest).super_EncoderTest._vptr_EncoderTest[0x13])(pDVar1);
  (this->super_DatarateTest).screen_mode_ = true;
  bVar3 = testing::internal::AlwaysTrue();
  if (bVar3) {
    testing::internal::HasNewFatalFailureHelper::HasNewFatalFailureHelper
              ((HasNewFatalFailureHelper *)local_110);
    bVar3 = testing::internal::AlwaysTrue();
    if (bVar3) {
      (*(pDVar1->super_EncoderTest)._vptr_EncoderTest[2])(pDVar1,&local_f0);
    }
    bVar3 = local_110[8];
    testing::internal::HasNewFatalFailureHelper::~HasNewFatalFailureHelper
              ((HasNewFatalFailureHelper *)local_110);
    if (bVar3 == false) {
      local_120.data_ =
           (AssertHelperData *)
           (double)(this->super_DatarateTest).super_EncoderTest.cfg_.rc_target_bitrate;
      local_118.data_ = (AssertHelperData *)((this->super_DatarateTest).effective_datarate_ * 0.85);
      testing::internal::CmpHelperGE<double,double>
                ((internal *)local_110,"static_cast<double>(cfg_.rc_target_bitrate)",
                 "effective_datarate_ * 0.85",(double *)&local_120,(double *)&local_118);
      if (local_110[0] == (string)0x0) {
        testing::Message::Message((Message *)&local_120);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&(local_120.data_)->line,
                   " The datarate for the file exceeds the target by too much!",0x3a);
        if ((undefined8 *)CONCAT71(local_110._9_7_,local_110[8]) == (undefined8 *)0x0) {
          pSVar6 = "";
        }
        else {
          pSVar6 = *(SEARCH_METHODS **)CONCAT71(local_110._9_7_,local_110[8]);
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_118,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/datarate_test.cc"
                   ,0x16d,(char *)pSVar6);
        testing::internal::AssertHelper::operator=(&local_118,(Message *)&local_120);
LAB_00610f9e:
        testing::internal::AssertHelper::~AssertHelper(&local_118);
        if (local_120.data_ != (AssertHelperData *)0x0) {
          (**(code **)(*(long *)local_120.data_ + 8))();
        }
      }
      else {
        puVar2 = (undefined8 *)CONCAT71(local_110._9_7_,local_110[8]);
        if (puVar2 != (undefined8 *)0x0) {
          if ((undefined8 *)*puVar2 != puVar2 + 2) {
            operator_delete((undefined8 *)*puVar2);
          }
          operator_delete(puVar2);
        }
        local_120.data_ =
             (AssertHelperData *)
             (double)(this->super_DatarateTest).super_EncoderTest.cfg_.rc_target_bitrate;
        local_118.data_ =
             (AssertHelperData *)((this->super_DatarateTest).effective_datarate_ * 1.15);
        testing::internal::CmpHelperLE<double,double>
                  ((internal *)local_110,"static_cast<double>(cfg_.rc_target_bitrate)",
                   "effective_datarate_ * 1.15",(double *)&local_120,(double *)&local_118);
        if (local_110[0] == (string)0x0) {
          testing::Message::Message((Message *)&local_120);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&(local_120.data_)->line,
                     " The datarate for the file missed the target!",0x2d);
          std::ostream::_M_insert<unsigned_long>((ulong)&(local_120.data_)->line);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&(local_120.data_)->line," ",1);
          std::ostream::_M_insert<double>((this->super_DatarateTest).effective_datarate_);
          if ((undefined8 *)CONCAT71(local_110._9_7_,local_110[8]) == (undefined8 *)0x0) {
            pSVar6 = "";
          }
          else {
            pSVar6 = *(SEARCH_METHODS **)CONCAT71(local_110._9_7_,local_110[8]);
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_118,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/datarate_test.cc"
                     ,0x170,(char *)pSVar6);
          testing::internal::AssertHelper::operator=(&local_118,(Message *)&local_120);
          goto LAB_00610f9e;
        }
      }
      puVar2 = (undefined8 *)CONCAT71(local_110._9_7_,local_110[8]);
      if (puVar2 != (undefined8 *)0x0) {
        if ((undefined8 *)*puVar2 != puVar2 + 2) {
          operator_delete((undefined8 *)*puVar2);
        }
        operator_delete(puVar2);
      }
      goto LAB_00610fdb;
    }
  }
  testing::Message::Message((Message *)local_110);
  testing::internal::AssertHelper::AssertHelper
            (&local_120,kFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/datarate_test.cc"
             ,0x16b,
             "Expected: RunLoop(&video) doesn\'t generate new fatal failures in the current thread.\n  Actual: it does."
            );
  testing::internal::AssertHelper::operator=(&local_120,(Message *)local_110);
  testing::internal::AssertHelper::~AssertHelper(&local_120);
  if ((long *)local_110._0_8_ != (long *)0x0) {
    (**(code **)(*(long *)local_110._0_8_ + 8))();
  }
LAB_00610fdb:
  libaom_test::Y4mVideoSource::~Y4mVideoSource(&local_f0);
  return;
}

Assistant:

virtual void BasicRateTargeting444CBRScreenTest() {
    ::libaom_test::Y4mVideoSource video("rush_hour_444.y4m", 0, 140);

    cfg_.g_profile = 1;
    cfg_.g_timebase = video.timebase();

    cfg_.rc_buf_initial_sz = 500;
    cfg_.rc_buf_optimal_sz = 500;
    cfg_.rc_buf_sz = 1000;
    cfg_.rc_dropframe_thresh = 1;
    cfg_.rc_min_quantizer = 0;
    cfg_.rc_max_quantizer = 63;
    cfg_.rc_end_usage = AOM_CBR;

    const int bitrate_array[2] = { 250, 650 };
    cfg_.rc_target_bitrate = bitrate_array[GET_PARAM(4)];
    ResetModel();
    screen_mode_ = true;
    ASSERT_NO_FATAL_FAILURE(RunLoop(&video));
    ASSERT_GE(static_cast<double>(cfg_.rc_target_bitrate),
              effective_datarate_ * 0.85)
        << " The datarate for the file exceeds the target by too much!";
    ASSERT_LE(static_cast<double>(cfg_.rc_target_bitrate),
              effective_datarate_ * 1.15)
        << " The datarate for the file missed the target!"
        << cfg_.rc_target_bitrate << " " << effective_datarate_;
  }